

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void Js::InterpreterStackFrame::TraceOpCode(InterpreterStackFrame *that,OpCode op)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  long lVar8;
  char16 *pcVar9;
  undefined6 in_register_00000032;
  
  piVar1 = (int *)(*(long *)(that + 0x78) + 0xb38 +
                  (CONCAT62(in_register_00000032,op) & 0xffffffff) * 4);
  *piVar1 = *piVar1 + 1;
  uVar6 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
  lVar3 = *(long *)(that + 0x88);
  lVar8 = *(long *)(lVar3 + 0x10);
  if (lVar8 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_0098985d;
    *puVar7 = 0;
    lVar8 = *(long *)(lVar3 + 0x10);
  }
  bVar5 = Phases::IsEnabled((Phases *)&DAT_015b6718,InterpreterPhase,uVar6,
                            *(LocalFunctionId *)(lVar8 + 0x10));
  if (!bVar5) {
    return;
  }
  uVar6 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
  lVar3 = *(long *)(that + 0x88);
  lVar8 = *(long *)(lVar3 + 0x10);
  if (lVar8 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) {
LAB_0098985d:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
    lVar8 = *(long *)(lVar3 + 0x10);
  }
  uVar2 = *(uint *)(lVar8 + 0x10);
  pcVar9 = OpCodeUtil::GetOpCodeName(op);
  Output::Print(L"%d.%d:Executing %s at offset 0x%X\n",(ulong)uVar6,(ulong)uVar2,pcVar9,
                *(undefined8 *)(that + 0x108));
  return;
}

Assistant:

void InterpreterStackFrame::TraceOpCode(InterpreterStackFrame* that, Js::OpCode op)
    {
#if DBG_DUMP
        that->scriptContext->byteCodeHistogram[(int)op]++;
        if (PHASE_TRACE(Js::InterpreterPhase, that->m_functionBody))
        {
            Output::Print(_u("%d.%d:Executing %s at offset 0x%X\n"), that->m_functionBody->GetSourceContextId(), that->m_functionBody->GetLocalFunctionId(), Js::OpCodeUtil::GetOpCodeName(op), that->DEBUG_currentByteOffset);
        }
#endif
    }